

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O2

void __thiscall
xLearn::Loss::Predict
          (Loss *this,DMatrix *matrix,Model *model,vector<float,_std::allocator<float>_> *pred)

{
  pointer pfVar1;
  pointer pfVar2;
  ulong uVar3;
  size_type sVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  allocator local_ae;
  allocator local_ad;
  Logger local_ac;
  DMatrix *local_a8;
  string local_a0;
  string local_80;
  Score *local_60;
  vector<float,_std::allocator<float>_> *local_58;
  Model *local_50;
  DMatrix *local_48;
  
  local_a8 = matrix;
  if (matrix == (DMatrix *)0x0) {
    local_ac.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.cc"
               ,&local_ad);
    std::__cxx11::string::string((string *)&local_a0,"Predict",&local_ae);
    poVar5 = Logger::Start(ERR,&local_80,0x36,&local_a0);
    poVar5 = std::operator<<(poVar5,"CHECK failed ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.cc"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x36);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"matrix");
    std::operator<<(poVar5," == NULL \n");
  }
  else {
    pfVar1 = (pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2 = (pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pfVar1 == pfVar2) {
      local_ac.severity_ = ERR;
      std::__cxx11::string::string
                ((string *)&local_80,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.cc"
                 ,&local_ad);
      std::__cxx11::string::string((string *)&local_a0,"Predict",&local_ae);
      poVar5 = Logger::Start(ERR,&local_80,0x37,&local_a0);
      poVar5 = std::operator<<(poVar5,"CHECK_NE failed ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.cc"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x37);
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"pred.empty()");
      poVar5 = std::operator<<(poVar5," = ");
      poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"true");
      poVar5 = std::operator<<(poVar5," = ");
      poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
      std::operator<<(poVar5,"\n");
    }
    else {
      uVar7 = (long)pfVar2 - (long)pfVar1 >> 2;
      if (uVar7 == matrix->row_length) {
        uVar6 = 0;
        while (uVar3 = this->threadNumber_, uVar6 < uVar3) {
          sVar4 = (uVar7 / uVar3) * (uVar6 + 1);
          local_80.field_2._M_allocated_capacity = (uVar7 / uVar3) * uVar6;
          local_80._M_string_length = uVar7 % uVar3 + sVar4;
          if (uVar6 != uVar3 - 1) {
            local_80._M_string_length = sVar4;
          }
          local_80._M_dataplus._M_p = (pointer)pred_thread;
          local_80.field_2._M_local_buf[8] = this->norm_;
          local_60 = this->score_func_;
          local_48 = local_a8;
          local_58 = pred;
          local_50 = model;
          ThreadPool::
          enqueue<std::_Bind<void(*(xLearn::DMatrix_const*,xLearn::Model*,std::vector<float,std::allocator<float>>*,xLearn::Score*,bool,unsigned_long,unsigned_long))(xLearn::DMatrix_const*,xLearn::Model*,std::vector<float,std::allocator<float>>*,xLearn::Score*,bool,unsigned_long,unsigned_long)>>
                    ((ThreadPool *)&stack0xffffffffffffffc0,
                     (_Bind<void_(*(const_xLearn::DMatrix_*,_xLearn::Model_*,_std::vector<float,_std::allocator<float>_>_*,_xLearn::Score_*,_bool,_unsigned_long,_unsigned_long))(const_xLearn::DMatrix_*,_xLearn::Model_*,_std::vector<float,_std::allocator<float>_>_*,_xLearn::Score_*,_bool,_unsigned_long,_unsigned_long)>
                      *)this->pool_);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
          uVar6 = uVar6 + 1;
        }
        ThreadPool::Sync(this->pool_,(int)uVar3);
        return;
      }
      local_ac.severity_ = ERR;
      std::__cxx11::string::string
                ((string *)&local_80,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.cc"
                 ,&local_ad);
      std::__cxx11::string::string((string *)&local_a0,"Predict",&local_ae);
      poVar5 = Logger::Start(ERR,&local_80,0x38,&local_a0);
      poVar5 = std::operator<<(poVar5,"CHECK_EQ failed ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.cc"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x38);
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"pred.size()");
      poVar5 = std::operator<<(poVar5," = ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"matrix->row_length");
      poVar5 = std::operator<<(poVar5," = ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,"\n");
    }
  }
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  Logger::~Logger(&local_ac);
  abort();
}

Assistant:

void Loss::Predict(const DMatrix* matrix,
                   Model& model,
                   std::vector<real_t>& pred) {
  CHECK_NOTNULL(matrix);
  CHECK_NE(pred.empty(), true);
  CHECK_EQ(pred.size(), matrix->row_length);
  index_t row_len = matrix->row_length;
  // Predict in multi-thread
  for (int i = 0; i < threadNumber_; ++i) {
    size_t start_idx = getStart(row_len, threadNumber_, i);
    size_t end_idx = getEnd(row_len, threadNumber_, i);
    pool_->enqueue(std::bind(pred_thread,
                             matrix,
                             &model,
                             &pred,
                             score_func_,
                             norm_,
                             start_idx,
                             end_idx));
  }
  // Wait all of the threads finish their job
  pool_->Sync(threadNumber_);
}